

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lddmc.c
# Opt level: O2

void print_example(MDD example)

{
  uint uVar1;
  undefined8 uVar2;
  long lVar3;
  int i;
  long lVar4;
  undefined8 uStack_40;
  uint32_t auStack_38 [2];
  
  if (example != 0) {
    lVar3 = -((ulong)(uint)vector_size * 4 + 0xf & 0xfffffffffffffff0);
    *(undefined8 *)((long)&uStack_40 + lVar3) = 0x104818;
    lddmc_sat_one(example,(uint32_t *)((long)auStack_38 + lVar3),(long)vector_size);
    *(undefined8 *)((long)&uStack_40 + lVar3) = 0x5b;
    uVar2 = *(undefined8 *)((long)&uStack_40 + lVar3);
    *(undefined8 *)((long)&uStack_40 + lVar3) = 0x104820;
    putchar((int)uVar2);
    *(undefined8 *)((long)&uStack_40 + lVar3) = 0x2c;
    uVar2 = *(undefined8 *)((long)&uStack_40 + lVar3);
    for (lVar4 = 0; lVar4 < vector_size; lVar4 = lVar4 + 1) {
      if (lVar4 != 0) {
        *(undefined8 *)((long)&uStack_40 + lVar3) = 0x104847;
        putchar((int)uVar2);
      }
      uVar1 = ((uint32_t *)((long)auStack_38 + lVar3))[lVar4];
      *(undefined8 *)((long)&uStack_40 + lVar3) = 0x104855;
      printf("%u",(ulong)uVar1);
    }
    *(undefined8 *)((long)&uStack_40 + lVar3) = 0x5d;
    uVar2 = *(undefined8 *)((long)&uStack_40 + lVar3);
    *(undefined8 *)((long)&uStack_40 + lVar3) = 0x104862;
    putchar((int)uVar2);
  }
  return;
}

Assistant:

static void
print_example(MDD example)
{
    if (example != lddmc_false) {
        uint32_t vec[vector_size];
        lddmc_sat_one(example, vec, vector_size);

        printf("[");
        for (int i=0; i<vector_size; i++) {
            if (i>0) printf(",");
            printf("%" PRIu32, vec[i]);
        }
        printf("]");
    }
}